

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocate.cpp
# Opt level: O0

void Relocation::dirRELOCATE_TABLE(void)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  ushort local_2a;
  ulong uStack_18;
  value_type offset;
  size_t offsetIndex;
  aint subtract_offset;
  
  offsetIndex._4_4_ = 0;
  iVar1 = SkipBlanks(&::lp);
  if ((iVar1 == 0) &&
     (iVar1 = ParseExpressionNoSyntaxError(&::lp,(aint *)((long)&offsetIndex + 4)), iVar1 == 0)) {
    Error("[RELOCATE_TABLE] Syntax error in <subtract_offset>",bp,SUPPRESS);
  }
  else {
    refreshMaxTableCount();
    for (uStack_18 = 0; uStack_18 < maxTableCount; uStack_18 = uStack_18 + 1) {
      sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)offsets);
      if (uStack_18 < sVar2) {
        pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)offsets,
                            uStack_18);
        local_2a = *pvVar3;
      }
      else {
        pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            offsetsPrevious,uStack_18);
        local_2a = *pvVar3;
      }
      EmitWord((uint)local_2a - offsetIndex._4_4_,false);
    }
    warnAboutContentChange = pass == 3;
  }
  return;
}

Assistant:

void Relocation::dirRELOCATE_TABLE() {
	aint subtract_offset = 0;
	if (!SkipBlanks(lp)) {	// should be either empty remaining of line, or <subtract_offset>
		if (!ParseExpressionNoSyntaxError(lp, subtract_offset)) {
			Error("[RELOCATE_TABLE] Syntax error in <subtract_offset>", bp, SUPPRESS);
			return;
		}
	}
	refreshMaxTableCount();
	// dump the table into machine code output
	for (size_t offsetIndex = 0; offsetIndex < maxTableCount; ++offsetIndex) {
		// select offset from current pass table if possible, but use "offsetsPrevious" as backup
		const auto offset = (offsetIndex < offsets.size()) ? offsets[offsetIndex] : offsetsPrevious[offsetIndex];
		EmitWord(offset - subtract_offset);
	}
	warnAboutContentChange = (LASTPASS == pass);	// set in last pass to check consistency
}